

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFutureProofing.cpp
# Opt level: O0

void anon_unknown.dwarf_ffb3f::testWriteRead(int partNumber)

{
  __type _Var1;
  ostream *poVar2;
  void *this;
  int in_EDI;
  exception *e_1;
  exception *e_2;
  bool caught;
  exception *e;
  int i;
  bool in_stack_00000077;
  int in_stack_00000344;
  int in_stack_000004a4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Testing file with ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_EDI);
  poVar2 = std::operator<<(poVar2," part(s).");
  this = (void *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(this,std::flush<char,std::char_traits<char>>);
  generateRandomFile(in_stack_00000344);
  readFirstPart();
  readWholeFiles(in_stack_000004a4);
  std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::operator[]
            ((vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *)
             (anonymous_namespace)::headers,0);
  Imf_3_2::Header::type_abi_cxx11_();
  _Var1 = std::operator==(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (!_Var1) {
    std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::operator[]
              ((vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *)
               (anonymous_namespace)::headers,0);
    Imf_3_2::Header::type_abi_cxx11_();
    _Var1 = std::operator==(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    if (!_Var1) {
      modifyType(in_stack_00000077);
      readFirstPart();
      std::operator<<((ostream *)&std::cerr," part reading succeeded but should have failed\n");
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                    ,0x600,"void (anonymous namespace)::testWriteRead(int)");
    }
  }
  modifyType(in_stack_00000077);
  readFirstPart();
  std::operator<<((ostream *)&std::cerr," part reading succeeded but should have failed\n");
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                ,0x5ec,"void (anonymous namespace)::testWriteRead(int)");
}

Assistant:

void
testWriteRead (int partNumber)
{
    cout << "Testing file with " << partNumber << " part(s)." << endl << flush;

    for (int i = 0; i < 40; i++)
    {
        generateRandomFile (partNumber);

        try
        {
            readFirstPart ();
        }
        catch (std::exception& e)
        {
            cerr << " part reading failed with " << e.what ()
                 << " but should have succeeded\n";
            assert (false);
        }

        readWholeFiles (0);

        bool caught = false;

        // for deep images, check that "version 2" files don't load
        if (headers[0].type () == DEEPSCANLINE ||
            headers[0].type () == DEEPTILE)
        {
            modifyType (true);
            try
            {
                caught = false;
                readFirstPart ();
                cerr << " part reading succeeded but should have failed\n";
                assert (false);
            }
            catch (std::exception& e)
            {
                cout << "received exception (" << e.what ()
                     << ") as expected\n";
                caught = true;
                // that's what we thought would happen
            }
            assert (caught);
            readWholeFiles (2);
        }

        modifyType (false);

        try
        {
            caught = false;
            readFirstPart ();
            cerr << " part reading succeeded but should have failed\n";
            assert (false);
        }
        catch (std::exception& e)
        {
            cout << "received exception (" << e.what () << ") as expected\n";
            caught = true;
            // that's what we thought would happen
        }
        assert (caught);

        // this should always succeed: it doesn't try to read the strange new type in part 0
        readWholeFiles (1);

        remove (filename.c_str ());
        cout << endl << flush;
    }
}